

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O3

int __thiscall
capnp::_::anon_unknown_0::TestVat::connect(TestVat *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  Entry **ppEVar1;
  TestNetwork *pTVar2;
  HashBucket *pHVar3;
  ulong uVar4;
  Entry *pEVar5;
  ArrayDisposer *pAVar6;
  long lVar7;
  ArrayDisposer *pAVar8;
  size_t sVar9;
  RemoveConst<kj::HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestVat>_>::Entry>
  *pRVar10;
  Disposer *pDVar11;
  undefined8 uVar12;
  byte bVar13;
  int iVar14;
  uint uVar15;
  HashBucket *pHVar16;
  size_t __n;
  _func_int **__n_00;
  undefined4 in_register_00000034;
  TestVat *pTVar17;
  char *condition;
  char *macroArgs;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  Reader RVar21;
  ArrayPtr<const_unsigned_char> s;
  undefined4 in_stack_00000008;
  undefined4 in_stack_0000000c;
  undefined4 in_stack_00000010;
  undefined4 in_stack_00000014;
  byte *in_stack_00000018;
  WirePointer *in_stack_00000020;
  int in_stack_00000028;
  short in_stack_0000002c;
  int in_stack_00000030;
  DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_&>_&,_const_kj::None_&>
  _kjCondition;
  Own<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl,_std::nullptr_t> remote;
  DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_&>_&,_const_kj::None_&>
  *in_stack_ffffffffffffff28;
  Fault local_c0;
  undefined1 local_b8 [32];
  undefined1 local_98 [24];
  int local_80;
  undefined4 uStack_7c;
  undefined1 local_78;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  pTVar17 = (TestVat *)CONCAT44(in_register_00000034,__fd);
  local_98._16_8_ = in_stack_00000020;
  if (in_stack_0000002c == 0) {
    local_98._16_8_ = (WirePointer *)0x0;
  }
  local_98._0_4_ = 0;
  local_98._4_4_ = 0;
  local_98._8_4_ = 0;
  local_98._12_4_ = 0;
  iVar14 = 0x7fffffff;
  if (in_stack_0000002c != 0) {
    local_98._0_4_ = in_stack_00000008;
    local_98._4_4_ = in_stack_0000000c;
    local_98._8_4_ = in_stack_00000010;
    local_98._12_4_ = in_stack_00000014;
    iVar14 = in_stack_00000030;
  }
  local_80 = iVar14;
  RVar21 = PointerReader::getBlob<capnp::Text>((PointerReader *)local_98,(void *)0x0,0);
  __n = RVar21.super_StringPtr.content.size_;
  local_68 = this;
  if ((__n == (pTVar17->self).content.size_) &&
     ((__n == 0 ||
      (iVar14 = bcmp(RVar21.super_StringPtr.content.ptr,(pTVar17->self).content.ptr,__n),
      iVar14 == 0)))) {
    (this->super_TestVatBase).super_VatNetworkBase._vptr_VatNetworkBase = (_func_int **)0x0;
    this->network = (TestNetwork *)0x0;
LAB_001fc13e:
    return (int)local_68;
  }
  pTVar2 = pTVar17->network;
  local_98._16_8_ = in_stack_00000020;
  if (in_stack_0000002c == 0) {
    local_98._16_8_ = (WirePointer *)0x0;
  }
  local_98._0_4_ = 0;
  local_98._4_4_ = 0;
  local_98._8_4_ = 0;
  local_98._12_4_ = 0;
  iVar14 = 0x7fffffff;
  if (in_stack_0000002c != 0) {
    local_98._0_4_ = in_stack_00000008;
    local_98._4_4_ = in_stack_0000000c;
    local_98._8_4_ = in_stack_00000010;
    local_98._12_4_ = in_stack_00000014;
    iVar14 = in_stack_00000030;
  }
  local_80 = iVar14;
  local_38 = pTVar17;
  RVar21 = PointerReader::getBlob<capnp::Text>((PointerReader *)local_98,(void *)0x0,0);
  __n_00 = RVar21.super_StringPtr.content.size_;
  local_58 = RVar21.super_StringPtr.content.ptr;
  local_60 = pTVar2;
  if ((pTVar2->map).table.indexes.buckets.size_ != 0) {
    local_50 = (pTVar2->map).table.rows.builder.ptr;
    s.size_ = (long)__n_00 - 1;
    s.ptr = (uchar *)local_58;
    uVar15 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,s);
    pHVar3 = (pTVar2->map).table.indexes.buckets.ptr;
    uVar4 = (pTVar2->map).table.indexes.buckets.size_;
    uVar20 = (ulong)((int)uVar4 - 1U & uVar15);
    uVar18 = pHVar3[uVar20].value;
    if (uVar18 != 0) {
      pHVar16 = pHVar3 + uVar20;
      do {
        if ((((uVar18 != 1) && (pHVar16->hash == uVar15)) &&
            (uVar19 = (ulong)(uVar18 - 2),
            ((ArrayDisposer *)(local_50 + (uVar19 * 4 + 1) * 8))->_vptr_ArrayDisposer == __n_00)) &&
           ((__n_00 == (_func_int **)0x0 ||
            (iVar14 = bcmp(((ArrayDisposer *)(local_50 + uVar19 * 4 * 8))->_vptr_ArrayDisposer,
                           (void *)local_58,(size_t)__n_00), iVar14 == 0)))) {
          uVar12 = local_38;
          pEVar5 = (((HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestVat,_std::nullptr_t>_>
                      *)(local_60 + 0x58))->table).rows.builder.ptr;
          if ((pEVar5 != (Entry *)0x0) &&
             (pTVar17 = pEVar5[uVar19].value.ptr, pTVar17 != (TestVat *)0x0)) {
            if ((in_stack_00000028 == 0) || (bVar13 = 1, (*in_stack_00000018 & 1) == 0)) {
              kj::
              HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>
              ::find<capnp::_::(anonymous_namespace)::TestVat*>
                        ((HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>
                          *)local_98,(TestVat **)(local_38 + 0x1c0));
              if ((SegmentReader *)local_98._0_8_ != (SegmentReader *)0x0) {
                pTVar2 = (TestNetwork *)*(Arena **)local_98._0_8_;
                ppEVar1 = &(pTVar2->dumper).schemas.table.rows.builder.endPtr;
                *(int *)ppEVar1 = *(int *)ppEVar1 + 1;
                *(RemoveConst<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry> ***)
                 local_68 = &(pTVar2->dumper).schemas.table.rows.builder.pos;
                *(TestNetwork **)(local_68 + 8) = pTVar2;
                goto LAB_001fc13e;
              }
              bVar13 = 0;
            }
            kj::
            refcounted<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl,capnp::_::(anonymous_namespace)::TestVat&,capnp::_::(anonymous_namespace)::TestVat&,kj::StringPtr&,bool&>
                      ((TestVat *)local_b8,(TestVat *)uVar12,(StringPtr *)pTVar17,
                       (bool *)(((StringPtr *)(uVar12 + 0x10))->content).ptr);
            condition = (char *)(pTVar17->self).content.size_;
            macroArgs = (char *)(ulong)bVar13;
            kj::
            refcounted<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl,capnp::_::(anonymous_namespace)::TestVat&,capnp::_::(anonymous_namespace)::TestVat&,kj::StringPtr&,bool&>
                      ((TestVat *)&stack0xffffffffffffffb8,pTVar17,(StringPtr *)uVar12,
                       (bool *)(pTVar17->self).content.ptr);
            local_98._0_8_ =
                 &(((TestNetwork *)(local_b8._8_8_ + 0xa8))->dumper).schemas.table.rows.builder.pos;
            local_78 = (((TestNetwork *)(local_b8._8_8_ + 0xa8))->dumper).schemas.table.rows.builder
                       .pos == (RemoveConst<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry>
                                *)0x0;
            local_98._8_8_ = &kj::none;
            local_98._16_8_ = " == ";
            _local_80 = 5;
            if (!(bool)local_78) {
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl&>&,kj::None_const&>&>
                        (&local_c0,(char *)0x12a,0x503cfe,(Type)local_98,condition,macroArgs,
                         in_stack_ffffffffffffff28);
              kj::_::Debug::Fault::fatal(&local_c0);
            }
            local_78 = *(long *)&((Context *)(local_40 + 0xa8))->line == 0;
            local_98._0_8_ = &((Context *)(local_40 + 0xa8))->line;
            local_98._8_8_ = &kj::none;
            local_98._16_8_ = " == ";
            _local_80 = 5;
            if (!(bool)local_78) {
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl&>&,kj::None_const&>&>
                        (&local_c0,(char *)0x12b,0x503cf8,(Type)local_98,condition,macroArgs,
                         in_stack_ffffffffffffff28);
              kj::_::Debug::Fault::fatal(&local_c0);
            }
            (((TestNetwork *)(local_b8._8_8_ + 0xa8))->dumper).schemas.table.rows.builder.pos =
                 (RemoveConst<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry> *)local_40;
            pAVar6 = (((Context *)local_40)->description).content.disposer;
            pAVar8 = (ArrayDisposer *)pAVar6[3]._vptr_ArrayDisposer;
            (((TestNetwork *)(local_b8._8_8_ + 0xa8))->dumper).schemas.table.rows.builder.endPtr =
                 (Entry *)pAVar6[2]._vptr_ArrayDisposer;
            (((TestNetwork *)(local_b8._8_8_ + 0xa8))->dumper).schemas.table.rows.builder.disposer =
                 pAVar8;
            *(undefined8 *)&((Context *)(local_40 + 0xa8))->line = local_b8._8_8_;
            lVar7 = *(long *)&(((RpcDumper *)local_b8._8_8_)->schemas).table.indexes;
            sVar9 = *(size_t *)(lVar7 + 0x18);
            (((Context *)(local_40 + 0xa8))->description).content.ptr = *(char **)(lVar7 + 0x10);
            (((Context *)(local_40 + 0xa8))->description).content.size_ = sVar9;
            *(Context **)(local_b8._8_8_ + 0x50) = (Context *)(local_40 + 0x38);
            (((Context *)(local_40 + 0x38))->description).content.size_ =
                 (size_t)&(((RpcDumper *)local_b8._8_8_)->schemas).table.indexes.buckets.size_;
            pRVar10 = (RemoveConst<kj::HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestVat>_>::Entry>
                       *)(((Context *)(local_40 + 0x38))->description).content.ptr;
            (((HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestVat,_std::nullptr_t>_>
               *)(local_b8._8_8_ + 0x58))->table).rows.builder.ptr =
                 *(Entry **)&((Context *)(local_40 + 0x38))->line;
            (((HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestVat,_std::nullptr_t>_>
               *)(local_b8._8_8_ + 0x58))->table).rows.builder.pos = pRVar10;
            pDVar11 = *(Disposer **)(local_b8._8_8_ + 0x48);
            (((Context *)(local_40 + 0x38))->description).content.disposer =
                 (((RpcDumper *)local_b8._8_8_)->schemas).table.indexes.buckets.disposer;
            (((Context *)(local_40 + 0x38))->next).ptr.disposer = pDVar11;
            local_b8._16_8_ = local_48;
            local_b8._24_8_ = local_40;
            local_40 = (Context *)0x0;
            kj::
            ProducerConsumerQueue<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>_>
            ::push(&pTVar17->acceptQueue,
                   (Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>
                    *)(local_b8 + 0x10));
            uVar12 = local_b8._24_8_;
            if ((Context *)local_b8._24_8_ != (Context *)0x0) {
              local_b8._24_8_ = 0;
              (***(_func_int ***)local_b8._16_8_)
                        (local_b8._16_8_,(long)(char **)uVar12 + *(long *)(*(char **)uVar12 + -0x10)
                        );
            }
            *(undefined8 *)local_68 = local_b8._0_8_;
            *(undefined8 *)(local_68 + 8) = local_b8._8_8_;
            goto LAB_001fc13e;
          }
          break;
        }
        uVar19 = uVar20 + 1;
        uVar20 = uVar19 & 0xffffffff;
        if (uVar19 == uVar4) {
          uVar20 = 0;
        }
        pHVar16 = pHVar3 + uVar20;
        uVar18 = pHVar16->value;
      } while (uVar18 != 0);
    }
  }
  local_b8._0_8_ = (Exception *)0x0;
  local_98._0_8_ = (SegmentReader *)0x0;
  local_98._8_8_ = (CapTableReader *)0x0;
  kj::_::Debug::Fault::init
            ((Fault *)local_b8,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
            );
  kj::_::Debug::Fault::fatal((Fault *)local_b8);
}

Assistant:

kj::Maybe<kj::Own<Connection>> connect(test::TestSturdyRefHostId::Reader hostId) override {
    if (hostId.getHost() == self) {
      return kj::none;
    }

    TestVat& dst = KJ_REQUIRE_NONNULL(network.find(hostId.getHost()));

    bool unique = hostId.getUnique();
    if (!unique) {
      KJ_IF_SOME(conn, connections.find(&dst)) {
        // Return existing connection.
        return kj::Own<Connection>(kj::addRef(*conn));
      }
    }

    // Create new connection.
    auto local = kj::refcounted<ConnectionImpl>(*this, dst, self, unique);
    auto remote = kj::refcounted<ConnectionImpl>(dst, *this, dst.self, unique);
    local->attach(*remote);

    dst.acceptQueue.push(kj::mv(remote));
    return kj::Own<Connection>(kj::mv(local));
  }